

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatchkit.hpp
# Opt level: O3

bool chaiscript::detail::Dispatch_Engine::function_less_than
               (Proxy_Function *lhs,Proxy_Function *rhs)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  element_type *peVar3;
  pointer pTVar4;
  bool bVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  Type_Info *this;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  ulong uVar9;
  long lVar10;
  pointer pTVar11;
  Type_Info *ti;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  bool bVar12;
  Type_Info boxed_pod_type;
  Type_Info boxed_type;
  Type_Info local_60;
  Type_Info local_48;
  
  peVar1 = (lhs->
           super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    lVar10 = 0;
  }
  else {
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    lVar6 = __dynamic_cast(peVar1,&dispatch::Proxy_Function_Base::typeinfo,
                           &dispatch::Dynamic_Proxy_Function::typeinfo,0);
    lVar10 = 0;
    if (lVar6 != 0) {
      this_00 = (lhs->
                super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
                )._M_refcount._M_pi;
      lVar10 = lVar6;
      if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      else if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
  }
  peVar1 = (rhs->
           super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    lVar6 = 0;
  }
  else {
    this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    lVar7 = __dynamic_cast(peVar1,&dispatch::Proxy_Function_Base::typeinfo,
                           &dispatch::Dynamic_Proxy_Function::typeinfo,0);
    lVar6 = 0;
    if (lVar7 != 0) {
      this_01 = (rhs->
                super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
                )._M_refcount._M_pi;
      lVar6 = lVar7;
      if (this_01 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      else if (__libc_single_threaded == '\0') {
        LOCK();
        this_01->_M_use_count = this_01->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_01->_M_use_count = this_01->_M_use_count + 1;
      }
    }
  }
  if (lVar10 != 0) {
    if (lVar6 == 0) {
      bVar12 = false;
    }
    else {
      lVar7 = *(long *)(lVar10 + 0x48);
      p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar10 + 0x50);
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        }
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      }
      if (lVar7 == 0) {
        bVar12 = false;
      }
      else {
        lVar10 = *(long *)(lVar6 + 0x48);
        p_Var2 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar6 + 0x50);
        if (p_Var2 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          bVar12 = lVar10 == 0;
        }
        else {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          }
          bVar12 = lVar10 == 0;
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
        }
      }
    }
    goto LAB_0029dff6;
  }
  pTVar11 = (pointer)0x1;
  bVar12 = true;
  if (lVar6 != 0) goto LAB_0029dff6;
  peVar1 = (lhs->
           super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  peVar3 = (rhs->
           super___shared_ptr<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  uVar8 = ((long)(peVar1->m_types).
                 super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(peVar1->m_types).
                 super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  uVar9 = ((long)(peVar3->m_types).
                 super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(peVar3->m_types).
                 super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  local_48.m_type_info = (type_info *)&Boxed_Value::typeinfo;
  local_48.m_bare_type_info = (type_info *)&Boxed_Value::typeinfo;
  local_48.m_flags = 0;
  local_60.m_type_info = (type_info *)&Boxed_Number::typeinfo;
  local_60.m_bare_type_info = (type_info *)&Boxed_Number::typeinfo;
  local_60.m_flags = 0;
  if (uVar8 < uVar9) {
    uVar9 = uVar8;
  }
  if (uVar9 < 2) {
    bVar12 = false;
  }
  else {
    this = (peVar1->m_types).
           super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>._M_impl
           .super__Vector_impl_data._M_start + 1;
    ti = (peVar3->m_types).
         super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>._M_impl.
         super__Vector_impl_data._M_start + 1;
    bVar12 = Type_Info::bare_equal(this,ti);
    if (bVar12) {
      bVar12 = true;
      lVar6 = 1;
      uVar8 = 2;
      lVar10 = 0x18;
      do {
        lVar7 = lVar10;
        if ((((byte)this->m_flags ^ (byte)ti->m_flags) & 1) != 0) goto LAB_0029df81;
        if (uVar9 == uVar8) {
          bVar12 = false;
          pTVar11 = ti;
          goto LAB_0029dfec;
        }
        lVar6 = lVar6 + 1;
        bVar12 = uVar8 < uVar9;
        pTVar11 = (peVar1->m_types).
                  super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        this = pTVar11 + lVar6;
        pTVar4 = (peVar3->m_types).
                 super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        ti = pTVar4 + lVar6;
        bVar5 = Type_Info::bare_equal
                          ((Type_Info *)((long)(pTVar11 + 1) + lVar7),
                           (Type_Info *)((long)(pTVar4 + 1) + lVar7));
        uVar8 = uVar8 + 1;
        lVar10 = lVar7 + 0x18;
      } while (bVar5);
      ti = (Type_Info *)((long)(pTVar4 + 1) + lVar7);
      this = (Type_Info *)((long)(pTVar11 + 1) + lVar7);
    }
    else {
      bVar12 = true;
    }
LAB_0029df81:
    bVar5 = Type_Info::bare_equal(this,ti);
    if (((bVar5) && ((this->m_flags & 1) != 0)) && ((ti->m_flags & 1) == 0)) {
LAB_0029dfce:
      pTVar11 = (pointer)0x0;
    }
    else {
      bVar5 = Type_Info::bare_equal(this,ti);
      if ((!bVar5) || (pTVar11 = (pointer)0x1, (this->m_flags & 1) != 0)) {
        bVar5 = Type_Info::bare_equal(this,&local_48);
        if (bVar5) goto LAB_0029dfce;
        bVar5 = Type_Info::bare_equal(ti,&local_48);
        pTVar11 = (pointer)0x1;
        if (!bVar5) {
          bVar5 = Type_Info::bare_equal(this,&local_60);
          if (bVar5) goto LAB_0029dfce;
          bVar5 = Type_Info::bare_equal(ti,&local_60);
          if (!bVar5) {
            bVar5 = std::type_info::before(this->m_type_info,ti->m_type_info);
            pTVar11 = (pointer)(ulong)bVar5;
          }
        }
      }
    }
  }
LAB_0029dfec:
  bVar12 = (bool)(bVar12 & (byte)pTVar11);
LAB_0029dff6:
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return bVar12;
}

Assistant:

static bool function_less_than(const Proxy_Function &lhs, const Proxy_Function &rhs) noexcept {
        auto dynamic_lhs(std::dynamic_pointer_cast<const dispatch::Dynamic_Proxy_Function>(lhs));
        auto dynamic_rhs(std::dynamic_pointer_cast<const dispatch::Dynamic_Proxy_Function>(rhs));

        if (dynamic_lhs && dynamic_rhs) {
          if (dynamic_lhs->get_guard()) {
            return dynamic_rhs->get_guard() ? false : true;
          } else {
            return false;
          }
        }

        if (dynamic_lhs && !dynamic_rhs) {
          return false;
        }

        if (!dynamic_lhs && dynamic_rhs) {
          return true;
        }

        const auto &lhsparamtypes = lhs->get_param_types();
        const auto &rhsparamtypes = rhs->get_param_types();

        const auto lhssize = lhsparamtypes.size();
        const auto rhssize = rhsparamtypes.size();

        const auto boxed_type = user_type<Boxed_Value>();
        const auto boxed_pod_type = user_type<Boxed_Number>();

        for (size_t i = 1; i < lhssize && i < rhssize; ++i) {
          const Type_Info &lt = lhsparamtypes[i];
          const Type_Info &rt = rhsparamtypes[i];

          if (lt.bare_equal(rt) && lt.is_const() == rt.is_const()) {
            continue; // The first two types are essentially the same, next iteration
          }

          // const is after non-const for the same type
          if (lt.bare_equal(rt) && lt.is_const() && !rt.is_const()) {
            return false;
          }

          if (lt.bare_equal(rt) && !lt.is_const()) {
            return true;
          }

          // boxed_values are sorted last
          if (lt.bare_equal(boxed_type)) {
            return false;
          }

          if (rt.bare_equal(boxed_type)) {
            return true;
          }

          if (lt.bare_equal(boxed_pod_type)) {
            return false;
          }

          if (rt.bare_equal(boxed_pod_type)) {
            return true;
          }

          // otherwise, we want to sort by typeid
          return lt < rt;
        }

        return false;
      }